

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MyDB_BufferManager.cc
# Opt level: O3

MyDB_PageHandle __thiscall MyDB_BufferManager::getPage(MyDB_BufferManager *this)

{
  _Elt_pointer puVar1;
  element_type *peVar2;
  unsigned_long uVar3;
  size_t sVar4;
  undefined8 *puVar5;
  MyDB_PageBase *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  MyDB_BufferManager *in_RSI;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  MyDB_PageHandle MVar7;
  pair<std::shared_ptr<MyDB_Table>,_long> local_60;
  pair<std::shared_ptr<MyDB_Table>,_long> local_48;
  
  puVar5 = (undefined8 *)operator_new(0x20);
  puVar5[1] = 0x100000001;
  *puVar5 = &PTR___Sp_counted_ptr_inplace_0010ecf0;
  puVar5[2] = 0;
  puVar5[3] = 0;
  *(undefined8 **)&(this->pageMap)._M_t._M_impl.super__Rb_tree_header._M_header = puVar5;
  *(undefined8 **)&(this->pageMap)._M_t._M_impl = puVar5 + 2;
  puVar1 = (in_RSI->slotQueue).c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Deque_impl_data._M_start._M_cur;
  if ((in_RSI->slotQueue).c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
      .super__Deque_impl_data._M_finish._M_cur == puVar1) {
    peVar2 = (in_RSI->tempTable).super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    this_01 = (in_RSI->tempTable).super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_01->_M_use_count = this_01->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_01->_M_use_count = this_01->_M_use_count + 1;
      }
    }
    sVar4 = in_RSI->curpos;
    this_00 = (MyDB_PageBase *)operator_new(0x38);
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_01->_M_use_count = this_01->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_01->_M_use_count = this_01->_M_use_count + 1;
      }
    }
    local_60.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
    local_60.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         this_01;
    local_60.second = sVar4;
    MyDB_PageBase::MyDB_PageBase(this_00,(void *)0x0,false,sVar4,false,0,&local_60,in_RSI);
    _Var6._M_pi = extraout_RDX_00;
    if (local_60.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_60.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      _Var6._M_pi = extraout_RDX_01;
    }
    in_RSI->curpos = in_RSI->curpos + 1;
  }
  else {
    peVar2 = (in_RSI->tempTable).super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    this_01 = (in_RSI->tempTable).super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_01->_M_use_count = this_01->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_01->_M_use_count = this_01->_M_use_count + 1;
      }
    }
    uVar3 = *puVar1;
    this_00 = (MyDB_PageBase *)operator_new(0x38);
    sVar4 = *(in_RSI->slotQueue).c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Deque_impl_data._M_start._M_cur;
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_01->_M_use_count = this_01->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_01->_M_use_count = this_01->_M_use_count + 1;
      }
    }
    local_48.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
    local_48.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         this_01;
    local_48.second = uVar3;
    MyDB_PageBase::MyDB_PageBase(this_00,(void *)0x0,false,sVar4,false,0,&local_48,in_RSI);
    if (local_48.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_48.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    std::deque<unsigned_long,_std::allocator<unsigned_long>_>::pop_front(&(in_RSI->slotQueue).c);
    _Var6._M_pi = extraout_RDX;
  }
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
    _Var6._M_pi = extraout_RDX_02;
  }
  puVar5 = *(undefined8 **)&(this->pageMap)._M_t._M_impl;
  *puVar5 = this_00;
  this_00->handleCount = this_00->handleCount + 1;
  puVar5[1] = in_RSI;
  MVar7.super___shared_ptr<MyDB_PageHandleBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var6._M_pi;
  MVar7.super___shared_ptr<MyDB_PageHandleBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (MyDB_PageHandle)MVar7.super___shared_ptr<MyDB_PageHandleBase,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

MyDB_PageHandle MyDB_BufferManager :: getPage () {

	// the handle we will return
	MyDB_PageHandle phd = make_shared<MyDB_PageHandleBase>();

	//New one page
	//If the slotQueue is not empty, then get slotId from the slotQueue
	MyDB_PageBase* newPage;
	if (!slotQueue.empty()) {
		// id for the anonymous page, offset equals to slot
		pair<MyDB_TablePtr, long> curId(tempTable, slotQueue.front());
		newPage = new MyDB_PageBase (nullptr, false, slotQueue.front(), false, 0, curId, this);
		slotQueue.pop();
	}
	//If the slotQueue is empty, means there is no slotId can be recycled, then use the curpos
	else{
		// id for the anonymous page, offset equals to slot
		pair<MyDB_TablePtr, long> curId(tempTable, curpos);
		newPage = new MyDB_PageBase (nullptr, false, curpos, false, 0, curId, this);
		curpos ++;
	}
	// Don't need to update the anonymous page into the pageMap
	phd -> pagePtr = newPage;

	phd -> pagePtr -> handleCount ++;
	phd->bufferManager = this;

	return phd;
}